

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::RandJoinClauseSyntax::setChild
          (RandJoinClauseSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined1 uVar1;
  NumericTokenFlags NVar2;
  uint32_t uVar3;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar6;
  long lVar7;
  
  if (index == 2) {
    ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    lVar7 = 0x38;
    if (*ppSVar5 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar5 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar6 = *ppSVar5;
    }
  }
  else if (index == 1) {
    pvVar4 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar4->field_0x2;
    NVar2.raw = (pvVar4->numFlags).raw;
    uVar3 = pvVar4->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar4->info;
    (this->join).kind = pvVar4->kind;
    (this->join).field_0x2 = uVar1;
    (this->join).numFlags = (NumericTokenFlags)NVar2.raw;
    (this->join).rawLen = uVar3;
    lVar7 = 0x30;
  }
  else {
    pvVar4 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar1 = pvVar4->field_0x2;
    NVar2.raw = (pvVar4->numFlags).raw;
    uVar3 = pvVar4->rawLen;
    pSVar6 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)pvVar4->info;
    (this->rand).kind = pvVar4->kind;
    (this->rand).field_0x2 = uVar1;
    (this->rand).numFlags = (NumericTokenFlags)NVar2.raw;
    (this->rand).rawLen = uVar3;
    lVar7 = 0x20;
  }
  *(variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *)
   ((long)&(this->super_SyntaxNode).kind + lVar7) = pSVar6;
  return;
}

Assistant:

void RandJoinClauseSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: rand = child.token(); return;
        case 1: join = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}